

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

int send_list(socket_server *ss,socket *s,wb_list *list,socket_message *result)

{
  socket_message *result_local;
  wb_list *list_local;
  socket *s_local;
  socket_server *ss_local;
  
  if (s->protocol == 0) {
    ss_local._4_4_ = send_list_tcp(ss,s,list,result);
  }
  else {
    ss_local._4_4_ = send_list_udp(ss,s,list,result);
  }
  return ss_local._4_4_;
}

Assistant:

static int
send_list(struct socket_server *ss, struct socket *s, struct wb_list *list, struct socket_message *result) {
	if (s->protocol == PROTOCOL_TCP) {
		return send_list_tcp(ss, s, list, result);
	} else {
		return send_list_udp(ss, s, list, result);
	}
}